

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cpp
# Opt level: O2

void duckdb_brotli::BrotliEstimateBitCostsForLiterals
               (size_t pos,size_t len,size_t mask,uint8_t *data,size_t *histogram,float *cost)

{
  long *plVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  byte bVar11;
  ulong *puVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined8 uVar22;
  size_t in_window_utf8 [3];
  ulong local_78 [4];
  double local_58;
  undefined8 uStack_50;
  ulong local_48;
  uint8_t *local_40;
  ulong local_38;
  
  iVar4 = BrotliIsMostlyUTF8(data,pos,mask,len,0.75);
  if (iVar4 == 0) {
    sVar10 = 2000;
    if (len < 2000) {
      sVar10 = len;
    }
    switchD_016d8eb1::default(histogram,0,0x800);
    sVar5 = pos;
    sVar8 = sVar10;
    while (bVar15 = sVar8 != 0, sVar8 = sVar8 - 1, bVar15) {
      histogram[data[sVar5 & mask]] = histogram[data[sVar5 & mask]] + 1;
      sVar5 = sVar5 + 1;
    }
    uVar14 = 0;
    local_40 = data;
    for (lVar9 = -2000; lVar9 - len != -2000; lVar9 = lVar9 + 1) {
      if (1999 < uVar14) {
        histogram[local_40[pos - 2000 & mask]] = histogram[local_40[pos - 2000 & mask]] - 1;
        sVar10 = sVar10 - 1;
      }
      if (uVar14 + 2000 < len) {
        histogram[local_40[pos + 2000 & mask]] = histogram[local_40[pos + 2000 & mask]] + 1;
        sVar10 = sVar10 + 1;
      }
      uVar7 = histogram[local_40[pos & mask]];
      lVar13 = uVar7 + (uVar7 == 0);
      if (sVar10 < 0x100) {
        dVar21 = *(double *)(kBrotliLog2Table + sVar10 * 8);
        uVar22 = 0;
      }
      else {
        auVar19._8_4_ = (int)(sVar10 >> 0x20);
        auVar19._0_8_ = sVar10;
        auVar19._12_4_ = 0x45300000;
        dVar21 = log2((auVar19._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0));
        uVar22 = extraout_XMM0_Qb_00;
      }
      if (uVar7 < 0x100) {
        dVar16 = *(double *)(kBrotliLog2Table + lVar13 * 8);
      }
      else {
        auVar20._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar20._0_8_ = lVar13;
        auVar20._12_4_ = 0x45300000;
        local_58 = dVar21;
        uStack_50 = uVar22;
        dVar16 = log2((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
        dVar21 = local_58;
      }
      dVar21 = (dVar21 - dVar16) + 0.029;
      cost[lVar9 + 2000] =
           (float)(double)(-(ulong)(dVar21 < 1.0) & (ulong)(dVar21 * 0.5 + 0.5) |
                          ~-(ulong)(dVar21 < 1.0) & (ulong)dVar21);
      uVar14 = uVar14 + 1;
      pos = pos + 1;
    }
  }
  else {
    local_78[0] = 0;
    local_38 = 0;
    local_48 = 0;
    bVar11 = 0;
    for (sVar10 = 0; len != sVar10; sVar10 = sVar10 + 1) {
      bVar2 = data[pos + sVar10 & mask];
      puVar12 = local_78;
      if ((((char)bVar2 < '\0') && (puVar12 = &local_38, bVar2 < 0xc0)) &&
         (puVar12 = local_78, 0xdf < bVar11)) {
        puVar12 = &local_48;
      }
      *puVar12 = *puVar12 + 1;
      bVar11 = bVar2;
    }
    uVar14 = (ulong)(0x18 < local_38 + local_48);
    sVar10 = 0x1ef;
    if (len < 0x1ef) {
      sVar10 = len;
    }
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[2] = 0;
    switchD_016d8eb1::default(histogram,0,0x1800);
    uVar7 = 0;
    sVar5 = pos;
    uVar6 = 0;
    while (bVar15 = sVar10 != 0, sVar10 = sVar10 - 1, bVar15) {
      bVar11 = data[sVar5 & mask];
      histogram[(ulong)bVar11 + uVar7 * 0x100] = histogram[(ulong)bVar11 + uVar7 * 0x100] + 1;
      local_78[uVar7] = local_78[uVar7] + 1;
      if ((char)bVar11 < '\0') {
        uVar7 = uVar14;
        if ((bVar11 < 0xc0) && (uVar6 < 0xe0)) {
          uVar7 = 0;
        }
      }
      else {
        uVar7 = 0;
      }
      sVar5 = sVar5 + 1;
      uVar6 = (ulong)bVar11;
    }
    lVar9 = 2000;
    for (uVar7 = 0; len != uVar7; uVar7 = uVar7 + 1) {
      if (0x1ee < uVar7) {
        if (uVar7 == 0x1ef) {
LAB_01f7a076:
          uVar6 = 0;
        }
        else {
          bVar15 = true;
          if (0x1f0 < uVar7) {
            bVar15 = data[(pos + uVar7) - 0x1f1 & mask] < 0xe0;
          }
          if (-1 < (char)data[(pos + uVar7) - 0x1f0 & mask]) goto LAB_01f7a076;
          uVar6 = uVar14;
          if (bVar15) {
            uVar6 = 0;
          }
          if (0xbf < data[(pos + uVar7) - 0x1f0 & mask]) {
            uVar6 = uVar14;
          }
        }
        plVar1 = (long *)((long)histogram +
                         (ulong)((int)uVar6 * 0x800 + (uint)data[(pos + uVar7) - 0x1ef & mask] * 8))
        ;
        *plVar1 = *plVar1 + -1;
        local_78[uVar6] = local_78[uVar6] - 1;
      }
      if (uVar7 + 0x1ef < len) {
        if ((char)data[pos + uVar7 + 0x1ee & mask] < '\0') {
          uVar6 = uVar14;
          if ((data[pos + uVar7 + 0x1ee & mask] < 0xc0) && (data[pos + uVar7 + 0x1ed & mask] < 0xe0)
             ) {
            uVar6 = 0;
          }
        }
        else {
          uVar6 = 0;
        }
        plVar1 = (long *)((long)histogram +
                         (ulong)((int)uVar6 * 0x800 + (uint)data[pos + uVar7 + 0x1ef & mask] * 8));
        *plVar1 = *plVar1 + 1;
        local_78[uVar6] = local_78[uVar6] + 1;
      }
      if (uVar7 == 0) {
LAB_01f7a143:
        uVar6 = 0;
      }
      else {
        bVar15 = true;
        if (uVar7 != 1) {
          bVar15 = data[(pos + uVar7) - 2 & mask] < 0xe0;
        }
        if (-1 < (char)data[(pos + uVar7) - 1 & mask]) goto LAB_01f7a143;
        uVar6 = uVar14;
        if (bVar15) {
          uVar6 = 0;
        }
        if (0xbf < data[(pos + uVar7) - 1 & mask]) {
          uVar6 = uVar14;
        }
      }
      uVar3 = *(ulong *)((long)histogram +
                        (ulong)((int)uVar6 * 0x800 + (uint)data[pos + uVar7 & mask] * 8));
      lVar13 = uVar3 + (uVar3 == 0);
      uVar6 = local_78[uVar6];
      if (uVar6 < 0x100) {
        dVar21 = *(double *)(kBrotliLog2Table + uVar6 * 8);
        uVar22 = 0;
      }
      else {
        auVar17._8_4_ = (int)(uVar6 >> 0x20);
        auVar17._0_8_ = uVar6;
        auVar17._12_4_ = 0x45300000;
        dVar21 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
        uVar22 = extraout_XMM0_Qb;
      }
      if (uVar3 < 0x100) {
        dVar16 = *(double *)(kBrotliLog2Table + lVar13 * 8);
      }
      else {
        auVar18._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar18._0_8_ = lVar13;
        auVar18._12_4_ = 0x45300000;
        local_58 = dVar21;
        uStack_50 = uVar22;
        dVar16 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
        dVar21 = local_58;
      }
      dVar21 = (dVar21 - dVar16) + 0.02905;
      dVar21 = (double)(-(ulong)(dVar21 < 1.0) & (ulong)(dVar21 * 0.5 + 0.5) |
                       ~-(ulong)(dVar21 < 1.0) & (ulong)dVar21);
      if (uVar7 < 2000) {
        dVar21 = dVar21 + ((double)lVar9 / -2000.0) * 0.35 + 0.7;
      }
      cost[uVar7] = (float)dVar21;
      lVar9 = lVar9 + -1;
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliEstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                       const uint8_t* data,
                                       size_t* histogram, float* cost) {
  if (BrotliIsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, histogram, cost);
    return;
  } else {
    size_t window_half = 2000;
    size_t in_window = BROTLI_MIN(size_t, window_half, len);
    size_t i;
    memset(histogram, 0, 256 * sizeof(histogram[0]));

    /* Bootstrap histogram. */
    for (i = 0; i < in_window; ++i) {
      ++histogram[data[(pos + i) & mask]];
    }

    /* Compute bit costs with sliding window. */
    for (i = 0; i < len; ++i) {
      size_t histo;
      if (i >= window_half) {
        /* Remove a byte in the past. */
        --histogram[data[(pos + i - window_half) & mask]];
        --in_window;
      }
      if (i + window_half < len) {
        /* Add a byte in the future. */
        ++histogram[data[(pos + i + window_half) & mask]];
        ++in_window;
      }
      histo = histogram[data[(pos + i) & mask]];
      if (histo == 0) {
        histo = 1;
      }
      {
        double lit_cost = FastLog2(in_window) - FastLog2(histo);
        lit_cost += 0.029;
        if (lit_cost < 1.0) {
          lit_cost *= 0.5;
          lit_cost += 0.5;
        }
        cost[i] = (float)lit_cost;
      }
    }
  }
}